

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O2

void __thiscall agge::tests::RendererTests::ScanlineIsOmittedIfCannotBegin(RendererTests *this)

{
  cell *pcVar1;
  bool bVar2;
  int iVar3;
  cell *pcVar4;
  cell *pcVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  scanline_cells sVar10;
  allocator local_1f1;
  scanline_mockup local_1f0;
  LocationInfo local_1c8;
  mask<8UL> mask;
  string local_178;
  span reference2 [4];
  span reference1 [3];
  cell cells3 [2];
  undefined1 local_d0 [8];
  undefined1 local_c8 [16];
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  cell local_a4;
  undefined1 local_98 [16];
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  cell local_74;
  scanline_cells cells [3];
  
  local_1f0.excepted_y = -1000000;
  local_1f0.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f0.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_1f0.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_1f0.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_1f0._25_8_ = 0;
  local_1f0._current_y = 0x7fffffff;
  cells[0].second = &local_74;
  local_98._0_4_ = 0;
  local_98._4_4_ = 0;
  local_88 = 0;
  uStack_7c = 0;
  local_98._8_8_ = 0xb00000011;
  uStack_84 = 0xfffffffd;
  uStack_80 = 0xd;
  local_78 = 0xfffffff2;
  cells[1].second = &local_a4;
  local_b8 = 0;
  uStack_ac = 0;
  local_c8._0_4_ = -1;
  local_c8._4_4_ = 0;
  local_c8._8_8_ = 0x7000000aa;
  uStack_b4 = 0xfffffffd;
  uStack_b0 = 0x11;
  local_a8 = 0xffffff59;
  cells[2].second = (cell *)local_d0;
  cells3[1].area = 0;
  cells3[1].cover = -0x75;
  cells3[0].x = 0;
  cells3[0].area = 0;
  cells3[0].cover = 0x75;
  cells3[1].x = 0xd;
  cells[0].first = (cell *)local_98;
  cells[1].first = (cell *)local_c8;
  cells[2].first = cells3;
  mocks::mask<8ul>::
  mask<std::pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>,3>
            ((mask<8ul> *)&mask,&cells,0x1f);
  local_1f0.excepted_y = 0x20;
  iVar8 = mask._height + mask._min_y;
  iVar7 = mask._min_y;
  do {
    if (iVar8 <= iVar7) {
      reference1[2].y = 0x21;
      reference1[2].x = 0;
      reference1[2].length = 0xd;
      reference1[2].cover = 0xea00;
      reference1[1].y = 0x1f;
      reference1[1].x = 0xb;
      reference1[1].length = 2;
      reference1[1].cover = 0x1c00;
      reference1[0].y = 0x1f;
      reference1[0].x = 0;
      reference1[0].length = 0xb;
      reference1[0].cover = 0x2200;
      std::__cxx11::string::string
                ((string *)&local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
                 ,(allocator *)&local_178);
      ut::LocationInfo::LocationInfo((LocationInfo *)reference2,&local_1c8.filename,0x250);
      ut::
      are_equal<agge::tests::(anonymous_namespace)::span,3ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
                (&reference1,&local_1f0.spans_log,(LocationInfo *)reference2);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      local_1f0.spans_log.
      super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_1_ =
           SUB81(local_1f0.spans_log.
                 super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                 ._M_impl.super__Vector_impl_data._M_start,0);
      local_1f0.spans_log.
      super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
      ._M_impl.super__Vector_impl_data._M_finish._1_7_ =
           (undefined7)
           ((ulong)local_1f0.spans_log.
                   super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 8);
      local_1f0.excepted_y = 0x21;
      iVar7 = mask._min_y;
      do {
        if (mask._height + mask._min_y <= iVar7) {
          reference2[3].y = 0x20;
          reference2[3].x = 7;
          reference2[3].length = 10;
          reference2[3].cover = 0x14e00;
          reference2[2].y = 0x20;
          reference2[2].x = -1;
          reference2[2].length = 8;
          reference2[2].cover = 0x15400;
          reference2[1].y = 0x1f;
          reference2[1].x = 0xb;
          reference2[1].length = 2;
          reference2[1].cover = 0x1c00;
          reference2[0].y = 0x1f;
          reference2[0].x = 0;
          reference2[0].length = 0xb;
          reference2[0].cover = 0x2200;
          std::__cxx11::string::string
                    ((string *)&local_178,
                     "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
                     ,&local_1f1);
          ut::LocationInfo::LocationInfo(&local_1c8,&local_178,0x25f);
          ut::
          are_equal<agge::tests::(anonymous_namespace)::span,4ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
                    (&reference2,&local_1f0.spans_log,&local_1c8);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          std::
          _Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
          ::~_Vector_base(&mask._cells.
                           super__Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
                         );
          anon_unknown_1::scanline_mockup::~scanline_mockup(&local_1f0);
          return;
        }
        sVar10 = mocks::mask<8UL>::operator[](&mask,iVar7);
        pcVar5 = sVar10.second;
        pcVar4 = sVar10.first;
        bVar2 = anon_unknown_1::scanline_mockup::begin(&local_1f0,iVar7);
        if (bVar2) {
          if (pcVar4 != pcVar5) {
            uVar9 = 0;
LAB_001819f3:
            iVar8 = pcVar4->x;
            iVar6 = 0;
            pcVar1 = pcVar4;
            do {
              pcVar4 = pcVar1 + 1;
              iVar6 = iVar6 + pcVar1->area;
              uVar9 = uVar9 + pcVar1->cover;
              if (pcVar4 == pcVar5) break;
              pcVar1 = pcVar4;
            } while (pcVar4->x == iVar8);
            if (iVar6 != 0) {
              anon_unknown_1::scanline_mockup::add_cell(&local_1f0,iVar8,uVar9 * 0x200 - iVar6);
              iVar8 = iVar8 + 1;
            }
            if (pcVar4 != pcVar5) {
              iVar6 = pcVar4->x - iVar8;
              if ((uVar9 & 0x7fffff) != 0 && iVar6 != 0) {
                anon_unknown_1::scanline_mockup::add_span(&local_1f0,iVar8,iVar6,uVar9 * 0x200);
              }
              goto LAB_001819f3;
            }
          }
          anon_unknown_1::scanline_mockup::commit(&local_1f0);
        }
        iVar7 = iVar7 + 1;
      } while( true );
    }
    sVar10 = mocks::mask<8UL>::operator[](&mask,iVar7);
    pcVar5 = sVar10.second;
    pcVar4 = sVar10.first;
    bVar2 = anon_unknown_1::scanline_mockup::begin(&local_1f0,iVar7);
    if (bVar2) {
      if (pcVar4 != pcVar5) {
        uVar9 = 0;
LAB_00181881:
        iVar6 = pcVar4->x;
        iVar3 = 0;
        pcVar1 = pcVar4;
        do {
          pcVar4 = pcVar1 + 1;
          iVar3 = iVar3 + pcVar1->area;
          uVar9 = uVar9 + pcVar1->cover;
          if (pcVar4 == pcVar5) break;
          pcVar1 = pcVar4;
        } while (pcVar4->x == iVar6);
        if (iVar3 != 0) {
          anon_unknown_1::scanline_mockup::add_cell(&local_1f0,iVar6,uVar9 * 0x200 - iVar3);
          iVar6 = iVar6 + 1;
        }
        if (pcVar4 != pcVar5) {
          iVar3 = pcVar4->x - iVar6;
          if ((uVar9 & 0x7fffff) != 0 && iVar3 != 0) {
            anon_unknown_1::scanline_mockup::add_span(&local_1f0,iVar6,iVar3,uVar9 * 0x200);
          }
          goto LAB_00181881;
        }
      }
      anon_unknown_1::scanline_mockup::commit(&local_1f0);
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

scanline_mockup(bool inprogress = true)
					: excepted_y(-1000000), _inprogress(inprogress), _current_y(0x7fffffff)
				{	}